

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frame.cpp
# Opt level: O0

ssize_t __thiscall ezc3d::DataNS::Frame::write(Frame *this,int __fd,void *__buf,size_t __n)

{
  undefined8 uVar1;
  Points *this_00;
  Analogs *this_01;
  ssize_t extraout_RAX;
  Rotations *this_02;
  ssize_t sVar2;
  runtime_error *this_03;
  void *__buf_00;
  undefined4 in_register_00000034;
  int in_R8D;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff60;
  vector<double,_std::allocator<double>_> *this_04;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff98;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa0;
  undefined1 local_40 [32];
  size_t local_20;
  void *local_18;
  undefined8 local_10;
  Frame *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_20 = __n;
  local_18 = __buf;
  local_8 = this;
  if (in_R8D == 0) {
    this_00 = points((Frame *)0x159dee);
    uVar1 = local_10;
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    Points3dNS::Points::write(this_00,(int)uVar1,local_40,__n);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff60);
    this_01 = analogs((Frame *)0x159e3e);
    uVar1 = local_10;
    this_04 = (vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff98;
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    AnalogsNS::Analogs::write(this_01,(int)uVar1,this_04,__n);
    std::vector<double,_std::allocator<double>_>::~vector(this_04);
    sVar2 = extraout_RAX;
  }
  else {
    if (in_R8D != 1) {
      this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_03,"Data type not implemented yet");
      __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_02 = rotations((Frame *)0x159ed7);
    sVar2 = RotationNS::Rotations::write(this_02,(int)local_10,__buf_00,__n);
  }
  return sVar2;
}

Assistant:

void ezc3d::DataNS::Frame::write(std::fstream &f,
                                 std::vector<double> pointScaleFactor,
                                 std::vector<double> analogScaleFactors,
                                 int dataTypeToWrite) const {
  if (dataTypeToWrite == 0) { // Points and analogs
    points().write(f, pointScaleFactor);
    analogs().write(f, analogScaleFactors);
  } else if (dataTypeToWrite == 1) { // Rotations
    rotations().write(f);
  } else {
    throw std::runtime_error("Data type not implemented yet");
  }
}